

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O0

char * add_file_name_to_url(CURL *curl,char *url,char *filename)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char *local_58;
  char *urlbuffer;
  char *encfile;
  char *file2;
  char *filep;
  char *ptr;
  char *filename_local;
  char *url_local;
  CURL *curl_local;
  
  pcVar1 = strstr(url,"://");
  filep = url;
  if (pcVar1 != (char *)0x0) {
    filep = pcVar1 + 3;
  }
  filep = strrchr(filep,0x2f);
  if (filep != (char *)0x0) {
    filep = filep + 1;
    sVar2 = strlen(filep);
    if (sVar2 != 0) {
      return url;
    }
  }
  pcVar1 = strrchr(filename,0x2f);
  local_58 = filename;
  if (pcVar1 != (char *)0x0) {
    local_58 = pcVar1;
  }
  pcVar3 = strrchr(local_58,0x5c);
  if (pcVar3 == (char *)0x0) {
    file2 = filename;
    if (pcVar1 != (char *)0x0) {
      file2 = pcVar1 + 1;
    }
  }
  else {
    file2 = pcVar3 + 1;
  }
  pcVar1 = (char *)curl_easy_escape(curl,file2,0);
  filename_local = url;
  if (pcVar1 != (char *)0x0) {
    sVar2 = strlen(url);
    sVar4 = strlen(pcVar1);
    filename_local = (char *)malloc(sVar2 + sVar4 + 3);
    if (filename_local == (char *)0x0) {
      curl_free(pcVar1);
      if (url != (char *)0x0) {
        free(url);
      }
      return (char *)0x0;
    }
    if (filep == (char *)0x0) {
      curl_msprintf(filename_local,"%s/%s",url,pcVar1);
    }
    else {
      curl_msprintf(filename_local,"%s%s",url,pcVar1);
    }
    curl_free(pcVar1);
    if (url != (char *)0x0) {
      free(url);
    }
  }
  return filename_local;
}

Assistant:

char *add_file_name_to_url(CURL *curl, char *url, const char *filename)
{
  /* If no file name part is given in the URL, we add this file name */
  char *ptr = strstr(url, "://");
  if(ptr)
    ptr += 3;
  else
    ptr = url;
  ptr = strrchr(ptr, '/');
  if(!ptr || !strlen(++ptr)) {
    /* The URL has no file name part, add the local file name. In order
       to be able to do so, we have to create a new URL in another
       buffer.*/

    /* We only want the part of the local path that is on the right
       side of the rightmost slash and backslash. */
    const char *filep = strrchr(filename, '/');
    char *file2 = strrchr(filep?filep:filename, '\\');
    char *encfile;

    if(file2)
      filep = file2 + 1;
    else if(filep)
      filep++;
    else
      filep = filename;

    /* URL encode the file name */
    encfile = curl_easy_escape(curl, filep, 0 /* use strlen */);
    if(encfile) {
      char *urlbuffer = malloc(strlen(url) + strlen(encfile) + 3);
      if(!urlbuffer) {
        curl_free(encfile);
        Curl_safefree(url);
        return NULL;
      }
      if(ptr)
        /* there is a trailing slash on the URL */
        sprintf(urlbuffer, "%s%s", url, encfile);
      else
        /* there is no trailing slash on the URL */
        sprintf(urlbuffer, "%s/%s", url, encfile);

      curl_free(encfile);
      Curl_safefree(url);

      url = urlbuffer; /* use our new URL instead! */
    }
  }
  return url;
}